

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

void Llb_ManGroupMarkNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsTravIdPrevious(p,pObj);
    if (iVar1 == 0) {
      Aig_ObjSetTravIdCurrent(p,pObj);
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                      ,0x128,"void Llb_ManGroupMarkNodes_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar2 = Aig_ObjFanin0(pObj);
      Llb_ManGroupMarkNodes_rec(p,pAVar2);
      pAVar2 = Aig_ObjFanin1(pObj);
      Llb_ManGroupMarkNodes_rec(p,pAVar2);
    }
    else {
      Aig_ObjSetTravIdCurrent(p,pObj);
    }
  }
  return;
}

Assistant:

void Llb_ManGroupMarkNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    if ( Aig_ObjIsTravIdPrevious(p, pObj) )
    {
        Aig_ObjSetTravIdCurrent(p, pObj);
        return;
    }
    Aig_ObjSetTravIdCurrent(p, pObj);
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManGroupMarkNodes_rec( p, Aig_ObjFanin0(pObj) );
    Llb_ManGroupMarkNodes_rec( p, Aig_ObjFanin1(pObj) );
}